

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BST.hpp
# Opt level: O2

void __thiscall
supermap::BST<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>::add
          (BST<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long> *this,Key<1UL> *key,
          ByteArray<1UL> *value)

{
  mapped_type *this_00;
  
  this_00 = std::
            map<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_std::less<supermap::Key<1UL>_>,_std::allocator<std::pair<const_supermap::Key<1UL>,_supermap::ByteArray<1UL>_>_>_>
            ::operator[](&this->map_,key);
  ByteArray<1UL>::operator=(this_00,value);
  return;
}

Assistant:

void add(const Key &key, Value &&value) override {
        map_[key] = std::move(value);
    }